

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O1

double __thiscall Belief::InnerProduct(Belief *this,vector<double,_std::allocator<double>_> *values)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pdVar2 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar3 != 0) {
    auVar5 = ZEXT816(0) << 0x40;
    uVar4 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pdVar2[uVar4];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar4];
      auVar5 = vfmadd231sd_fma(auVar5,auVar6,auVar1);
      uVar4 = uVar4 + 1;
    } while (lVar3 >> 3 != (uVar4 & 0xffffffff));
    return auVar5._0_8_;
  }
  return 0.0;
}

Assistant:

double Belief::InnerProduct(const vector<double> &values) const
{
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif

    double x=0;
    for(unsigned int s=0; s!=_m_b.size(); ++s)
        x+=_m_b[s]*values[s];

    return(x);
}